

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O2

void __thiscall cmInstallProgramsCommand::FinalPass(cmInstallProgramsCommand *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  MessageLevel message;
  char *pcVar3;
  cmInstallFilesGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Alloc_hider _Var4;
  iterator s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  allocator local_8a;
  allocator local_89;
  string destination;
  string no_component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_configurations;
  
  __lhs = (this->FinalArgs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (this->FinalArgs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = false;
    pbVar5 = __lhs;
  }
  else {
    bVar2 = std::operator==(__lhs,"FILES");
    __lhs = (this->FinalArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((bVar2 == false) && ((ulong)((long)__lhs - (long)pbVar5) < 0x21)) {
    no_component._M_dataplus._M_p = (pointer)0x0;
    no_component._M_string_length = 0;
    no_component.field_2._M_allocated_capacity = 0;
    pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&destination,pcVar3,(allocator *)&no_configurations);
    cmSystemTools::Glob(&destination,
                        (this->FinalArgs).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&no_component);
    std::__cxx11::string::~string((string *)&destination);
    for (_Var4 = no_component._M_dataplus; _Var4._M_p != (pointer)no_component._M_string_length;
        _Var4._M_p = _Var4._M_p + 0x20) {
      FindInstallSource_abi_cxx11_(&destination,this,*(char **)_Var4._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files,
                 &destination);
      std::__cxx11::string::~string((string *)&destination);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&no_component);
  }
  else {
    for (pbVar5 = pbVar5 + bVar2; pbVar5 != __lhs; pbVar5 = pbVar5 + 1) {
      FindInstallSource_abi_cxx11_(&destination,this,(pbVar5->_M_dataplus)._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files,
                 &destination);
      std::__cxx11::string::~string((string *)&destination);
      __lhs = (this->FinalArgs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  std::__cxx11::string::substr((ulong)&destination,(ulong)&this->Destination);
  cmsys::SystemTools::ConvertToUnixSlashes(&destination);
  if (destination._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&destination);
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string
            ((string *)&no_configurations,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME",&local_89);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&no_configurations);
  std::__cxx11::string::string((string *)&no_component,pcVar3,&local_8a);
  std::__cxx11::string::~string((string *)&no_configurations);
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
  pcVar1 = (this->super_cmCommand).Makefile;
  this_00 = (cmInstallFilesGenerator *)operator_new(0x120);
  cmInstallFilesGenerator::cmInstallFilesGenerator
            (this_00,&this->Files,destination._M_dataplus._M_p,true,"",&no_configurations,
             no_component._M_dataplus._M_p,message,false,"",false);
  cmMakefile::AddInstallGenerator(pcVar1,(cmInstallGenerator *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_configurations);
  std::__cxx11::string::~string((string *)&no_component);
  std::__cxx11::string::~string((string *)&destination);
  return;
}

Assistant:

void cmInstallProgramsCommand::FinalPass()
{
  bool files_mode = false;
  if (!this->FinalArgs.empty() && this->FinalArgs[0] == "FILES") {
    files_mode = true;
  }

  // two different options
  if (this->FinalArgs.size() > 1 || files_mode) {
    // for each argument, get the programs
    std::vector<std::string>::iterator s = this->FinalArgs.begin();
    if (files_mode) {
      // Skip the FILES argument in files mode.
      ++s;
    }
    for (; s != this->FinalArgs.end(); ++s) {
      // add to the result
      this->Files.push_back(this->FindInstallSource(s->c_str()));
    }
  } else // reg exp list
  {
    std::vector<std::string> programs;
    cmSystemTools::Glob(this->Makefile->GetCurrentSourceDirectory(),
                        this->FinalArgs[0], programs);

    std::vector<std::string>::iterator s = programs.begin();
    // for each argument, get the programs
    for (; s != programs.end(); ++s) {
      this->Files.push_back(this->FindInstallSource(s->c_str()));
    }
  }

  // Construct the destination.  This command always installs under
  // the prefix.  We skip the leading slash given by the user.
  std::string destination = this->Destination.substr(1);
  cmSystemTools::ConvertToUnixSlashes(destination);
  if (destination.empty()) {
    destination = ".";
  }

  // Use a file install generator.
  const char* no_permissions = "";
  const char* no_rename = "";
  bool no_exclude_from_all = false;
  std::string no_component =
    this->Makefile->GetSafeDefinition("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
  std::vector<std::string> no_configurations;
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);
  this->Makefile->AddInstallGenerator(new cmInstallFilesGenerator(
    this->Files, destination.c_str(), true, no_permissions, no_configurations,
    no_component.c_str(), message, no_exclude_from_all, no_rename));
}